

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface_p.h
# Opt level: O3

void __thiscall QWindowSystemInterfacePrivate::TouchEvent::~TouchEvent(TouchEvent *this)

{
  Data *pDVar1;
  
  (this->super_PointerEvent).super_InputEvent.super_UserEvent.super_WindowSystemEvent.
  _vptr_WindowSystemEvent = (_func_int **)&PTR__TouchEvent_007d4210;
  QArrayDataPointer<QEventPoint>::~QArrayDataPointer(&(this->points).d);
  (this->super_PointerEvent).super_InputEvent.super_UserEvent.super_WindowSystemEvent.
  _vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d41f0;
  pDVar1 = (this->super_PointerEvent).super_InputEvent.super_UserEvent.window.wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      pDVar1 = (this->super_PointerEvent).super_InputEvent.super_UserEvent.window.wp.d;
      if (pDVar1 == (Data *)0x0) {
        pDVar1 = (Data *)0x0;
      }
      operator_delete(pDVar1);
    }
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

TouchEvent(QWindow *w, ulong time, QEvent::Type t, const QPointingDevice *device,
                   const QList<QEventPoint> &p, Qt::KeyboardModifiers mods)
            : PointerEvent(w, time, Touch, mods, device), points(p), touchType(t) { }